

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void message_written(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  cio_websocket_write_job *job;
  cio_error err_00;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined4 in_register_00000014;
  
  puVar4 = *(undefined8 **)((long)handler_context + 0x218);
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = (undefined8 *)0x0;
  }
  else {
    if (puVar4 == *(undefined8 **)((long)handler_context + 0x220)) {
      uVar5 = 0;
    }
    else {
      uVar5 = *puVar4;
    }
    *(undefined8 *)((long)handler_context + 0x218) = uVar5;
  }
  plVar1 = (long *)puVar4[1];
  plVar2 = (long *)*plVar1;
  if (plVar2 != (long *)0x0 && plVar2 != plVar1) {
    plVar1[2] = plVar1[2] + -1;
    plVar1[3] = plVar1[3] - plVar2[3];
    lVar3 = *plVar2;
    plVar1 = (long *)plVar2[1];
    *(long **)(lVar3 + 8) = plVar1;
    *plVar1 = lVar3;
  }
  puVar4[1] = 0;
  job = *(cio_websocket_write_job **)((long)handler_context + 0x218);
  (*(code *)puVar4[8])(handler_context,puVar4[9],CONCAT44(in_register_00000014,err));
  if (job != (cio_websocket_write_job *)0x0) {
    err_00 = send_frame((cio_websocket *)handler_context,job,(job->wbh->data).element.length);
    if (err_00 != CIO_SUCCESS) {
      handle_error((cio_websocket *)handler_context,err_00,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "could not send next frame");
      return;
    }
  }
  return;
}

Assistant:

static void message_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	const struct cio_websocket_write_job *job = write_jobs_popfront(websocket);
	struct cio_websocket_write_job *first_job = websocket->ws_private.first_write_job;

	job->handler(websocket, job->handler_context, err);

	if (first_job != NULL) {
		size_t length = cio_write_buffer_get_total_size(first_job->wbh);
		err = send_frame(websocket, first_job, length);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "could not send next frame");
		}
	}
}